

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef fold_simplify_intsub_k64(jit_State *J)

{
  long lVar1;
  TRef TVar2;
  uint uVar3;
  
  lVar1 = *(long *)&(J->fold).right[1].i;
  if (lVar1 == 0) {
    uVar3 = (uint)(J->fold).ins.field_0.op1;
  }
  else {
    (J->fold).ins.field_1.o = ')';
    TVar2 = lj_ir_kint64(J,-lVar1);
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

LJFOLD(SUB any KINT64)
LJFOLDF(simplify_intsub_k64)
{
  uint64_t k = ir_kint64(fright)->u64;
  if (k == 0)  /* i - 0 ==> i */
    return LEFTFOLD;
  fins->o = IR_ADD;  /* i - k ==> i + (-k) */
  fins->op2 = (IRRef1)lj_ir_kint64(J, ~k+1u);
  return RETRYFOLD;
}